

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

ParseResult __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
Parse<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<true> *handler)

{
  Ch *pCVar1;
  ulong uVar2;
  byte *pbVar3;
  ParseResult PVar4;
  
  *(undefined4 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  pbVar3 = (byte *)is->src_;
  while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
    pbVar3 = pbVar3 + 1;
  }
  is->src_ = (Ch *)pbVar3;
  uVar2 = (ulong)*(uint *)(this + 0x30);
  if (*(uint *)(this + 0x30) != 0) goto LAB_001b675c;
  if (*pbVar3 == 0) {
    uVar2 = 1;
  }
  else {
    ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
              (this,is,handler);
    uVar2 = (ulong)*(uint *)(this + 0x30);
    if (*(uint *)(this + 0x30) != 0) goto LAB_001b675c;
    pbVar3 = (byte *)is->src_;
    while (((ulong)*pbVar3 < 0x21 && ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) != 0))) {
      pbVar3 = pbVar3 + 1;
    }
    is->src_ = (Ch *)pbVar3;
    uVar2 = (ulong)*(uint *)(this + 0x30);
    if ((*(uint *)(this + 0x30) != 0) || (uVar2 = 0, *pbVar3 == 0)) goto LAB_001b675c;
    uVar2 = 2;
  }
  pCVar1 = is->head_;
  *(int *)(this + 0x30) = (int)uVar2;
  *(long *)(this + 0x38) = (long)pbVar3 - (long)pCVar1;
LAB_001b675c:
  *(undefined8 *)(this + 0x18) = *(undefined8 *)(this + 0x10);
  PVar4.offset_ = *(size_t *)(this + 0x38);
  PVar4._0_8_ = uVar2;
  return PVar4;
}

Assistant:

ParseResult Parse(InputStream& is, Handler& handler)
  { if (parseFlags & kParseIterativeFlag)
      return IterativeParse<parseFlags>(is, handler);

    parseResult_.Clear();

    ClearStackOnExit scope(*this);

    SkipWhitespaceAndComments<parseFlags>(is);
    RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

    if (RAPIDJSON_UNLIKELY(is.Peek() == '\0'))
    { RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentEmpty, is.Tell());
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
    }
    else
    { ParseValue<parseFlags>(is, handler);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

      if (!(parseFlags & kParseStopWhenDoneFlag))
      { SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

        if (RAPIDJSON_UNLIKELY(is.Peek() != '\0'))
        { RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentRootNotSingular, is.Tell());
          RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
        }
      }
    }

    return parseResult_;
  }